

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

void * __thiscall
kj::Arena::allocateBytes(Arena *this,size_t amount,uint alignment,bool hasDisposer)

{
  byte *pbVar1;
  size_t sVar2;
  uint uVar3;
  void *pvVar4;
  ChunkHeader *pCVar5;
  undefined7 in_register_00000009;
  uintptr_t mask;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((int)CONCAT71(in_register_00000009,hasDisposer) != 0) {
    uVar3 = 8;
    if (8 < alignment) {
      uVar3 = alignment;
    }
    uVar6 = (ulong)(uVar3 - 1);
    pvVar4 = allocateBytesInternal(this,(uVar6 + 0x10 & ~uVar6) + amount,uVar3);
    return (void *)((long)pvVar4 + uVar6 + 0x10 & ~uVar6);
  }
  pCVar5 = this->currentChunk;
  if (pCVar5 != (ChunkHeader *)0x0) {
    pbVar1 = pCVar5->pos;
    pvVar4 = (void *)(~(ulong)(alignment - 1) & (ulong)(pbVar1 + (alignment - 1)));
    if ((amount - (long)pbVar1) + (long)pvVar4 <= (ulong)((long)pCVar5->end - (long)pbVar1)) {
      pCVar5->pos = (byte *)(amount + (long)pvVar4);
      return pvVar4;
    }
  }
  uVar3 = 8;
  if (8 < alignment) {
    uVar3 = alignment;
  }
  uVar8 = (ulong)(uVar3 - 1);
  uVar7 = (uVar8 + 0x18 & ~uVar8) + amount;
  uVar6 = this->nextChunkSize;
  if (uVar6 < uVar7) {
    do {
      uVar6 = uVar6 * 2;
    } while (uVar6 < uVar7);
    this->nextChunkSize = uVar6;
  }
  pCVar5 = (ChunkHeader *)operator_new(uVar6);
  pCVar5->next = this->chunkList;
  pCVar5->pos = (byte *)((long)&pCVar5->next + uVar7);
  sVar2 = this->nextChunkSize;
  pCVar5->end = (byte *)((long)&pCVar5->next + sVar2);
  this->currentChunk = pCVar5;
  this->chunkList = pCVar5;
  this->nextChunkSize = sVar2 * 2;
  return (void *)((long)&pCVar5[1].next + uVar8 & ~uVar8);
}

Assistant:

void* Arena::allocateBytes(size_t amount, uint alignment, bool hasDisposer) {
  if (hasDisposer) {
    alignment = kj::max(alignment, alignof(ObjectHeader));
    amount += alignTo(sizeof(ObjectHeader), alignment);
  }

  void* result = allocateBytesInternal(amount, alignment);

  if (hasDisposer) {
    // Reserve space for the ObjectHeader, but don't add it to the object list yet.
    result = alignTo(reinterpret_cast<byte*>(result) + sizeof(ObjectHeader), alignment);
  }

  KJ_DASSERT(reinterpret_cast<uintptr_t>(result) % alignment == 0);
  return result;
}